

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O1

void __thiscall
SourceMapTest_OptionalFields_Test::~SourceMapTest_OptionalFields_Test
          (SourceMapTest_OptionalFields_Test *this)

{
  SourceMapReader *pSVar1;
  pointer pcVar2;
  
  (this->super_SourceMapTest).super_PrintTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SourceMapTest_002d0fc0;
  pSVar1 = (this->super_SourceMapTest).reader._M_t.
           super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>
           .super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl;
  if (pSVar1 != (SourceMapReader *)0x0) {
    operator_delete(pSVar1,0x40);
  }
  (this->super_SourceMapTest).reader._M_t.
  super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>._M_t.
  super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>.
  super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl = (SourceMapReader *)0x0;
  ::wasm::Module::~Module(&(this->super_SourceMapTest).wasm);
  pcVar2 = (this->super_SourceMapTest).buffer.super__Vector_base<char,_std::allocator<char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2,(long)(this->super_SourceMapTest).buffer.
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar2);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x428);
  return;
}

Assistant:

TEST_F(SourceMapTest, OptionalFields) {
  // The "names" field is optional.
  std::string sourceMap = R"(
    {
      "version": 3,
      "sources": [],
      "mappings": "A"
    }
  )";
  parseMap(sourceMap);
}